

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_Error cff_index_access_element
                   (CFF_Index idx,FT_UInt element,FT_Byte **pbytes,FT_ULong *pbyte_len)

{
  FT_ULong *pFVar1;
  unsigned_long uVar2;
  FT_ULong FVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  FT_ULong count;
  FT_Stream stream;
  FT_Error error;
  FT_Error local_3c;
  FT_Stream local_38;
  
  local_3c = 0;
  if ((idx == (CFF_Index)0x0) || (idx->count <= element)) {
    return 6;
  }
  stream = idx->stream;
  pFVar1 = idx->offsets;
  if (pFVar1 == (FT_ULong *)0x0) {
    local_38 = stream;
    local_3c = FT_Stream_Seek(stream,(ulong)idx->hdr_size + idx->start +
                                     (ulong)(idx->off_size * element));
    if (local_3c != 0) {
      return local_3c;
    }
    FVar3 = cff_index_read_offset(idx,&local_3c);
    if (local_3c != 0) {
      return local_3c;
    }
    stream = local_38;
    if (FVar3 != 0) {
      do {
        uVar4 = cff_index_read_offset(idx,&local_3c);
        stream = local_38;
        if (uVar4 != 0) goto LAB_00222c51;
        element = element + 1;
      } while (element < idx->count);
    }
  }
  else {
    uVar5 = (ulong)element;
    FVar3 = pFVar1[uVar5];
    if (FVar3 != 0) {
      do {
        uVar4 = pFVar1[uVar5 + 1];
        if (uVar4 != 0) goto LAB_00222c51;
        uVar5 = uVar5 + 1;
      } while (idx->count != uVar5);
    }
  }
  uVar2 = stream->size;
  uVar4 = 0;
LAB_00222ba2:
  uVar6 = idx->data_offset;
  uVar5 = uVar2 + 1;
  if (uVar6 <= uVar5 - uVar4) goto LAB_00222c6d;
LAB_00222c67:
  uVar4 = uVar5 - uVar6;
LAB_00222c6d:
  if ((FVar3 == 0) || (count = uVar4 - FVar3, uVar4 < FVar3 || count == 0)) {
    *pbytes = (FT_Byte *)0x0;
    *pbyte_len = 0;
  }
  else {
    *pbyte_len = count;
    if (idx->bytes == (FT_Byte *)0x0) {
      local_3c = FT_Stream_Seek(stream,(idx->data_offset + FVar3) - 1);
      if (local_3c == 0) {
        local_3c = FT_Stream_ExtractFrame(stream,count,pbytes);
      }
    }
    else {
      *pbytes = idx->bytes + (FVar3 - 1);
    }
  }
  return local_3c;
LAB_00222c51:
  uVar2 = stream->size;
  uVar5 = uVar2 + 1;
  if (uVar4 <= uVar5) goto LAB_00222ba2;
  uVar6 = idx->data_offset;
  goto LAB_00222c67;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_index_access_element( CFF_Index  idx,
                            FT_UInt    element,
                            FT_Byte**  pbytes,
                            FT_ULong*  pbyte_len )
  {
    FT_Error  error = FT_Err_Ok;


    if ( idx && idx->count > element )
    {
      /* compute start and end offsets */
      FT_Stream  stream = idx->stream;
      FT_ULong   off1, off2 = 0;


      /* load offsets from file or the offset table */
      if ( !idx->offsets )
      {
        FT_ULong  pos = element * idx->off_size;


        if ( FT_STREAM_SEEK( idx->start + idx->hdr_size + pos ) )
          goto Exit;

        off1 = cff_index_read_offset( idx, &error );
        if ( error )
          goto Exit;

        if ( off1 != 0 )
        {
          do
          {
            element++;
            off2 = cff_index_read_offset( idx, &error );

          } while ( off2 == 0 && element < idx->count );
        }
      }
      else   /* use offsets table */
      {
        off1 = idx->offsets[element];
        if ( off1 )
        {
          do
          {
            element++;
            off2 = idx->offsets[element];

          } while ( off2 == 0 && element < idx->count );
        }
      }

      /* XXX: should check off2 does not exceed the end of this entry; */
      /*      at present, only truncate off2 at the end of this stream */
      if ( off2 > stream->size + 1                    ||
           idx->data_offset > stream->size - off2 + 1 )
      {
        FT_ERROR(( "cff_index_access_element:"
                   " offset to next entry (%ld)"
                   " exceeds the end of stream (%ld)\n",
                   off2, stream->size - idx->data_offset + 1 ));
        off2 = stream->size - idx->data_offset + 1;
      }

      /* access element */
      if ( off1 && off2 > off1 )
      {
        *pbyte_len = off2 - off1;

        if ( idx->bytes )
        {
          /* this index was completely loaded in memory, that's easy */
          *pbytes = idx->bytes + off1 - 1;
        }
        else
        {
          /* this index is still on disk/file, access it through a frame */
          if ( FT_STREAM_SEEK( idx->data_offset + off1 - 1 ) ||
               FT_FRAME_EXTRACT( off2 - off1, *pbytes )      )
            goto Exit;
        }
      }
      else
      {
        /* empty index element */
        *pbytes    = 0;
        *pbyte_len = 0;
      }
    }
    else
      error = FT_THROW( Invalid_Argument );

  Exit:
    return error;
  }